

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O1

REF_STATUS
ref_facelift_create(REF_FACELIFT *ref_facelift_ptr,REF_GRID freeable_ref_grid,REF_BOOL direct)

{
  size_t __size;
  REF_GEOM ref_geom;
  REF_CELL pRVar1;
  bool bVar2;
  uint uVar3;
  REF_STATUS RVar4;
  REF_FACELIFT pRVar5;
  REF_SEARCH *ppRVar6;
  ulong uVar7;
  REF_DBL *__s;
  long lVar8;
  REF_BOOL *__s_00;
  REF_STATUS unaff_R12D;
  ulong uVar9;
  int iVar10;
  long lVar11;
  REF_INT nodes [27];
  double local_d0;
  REF_DBL local_c8 [4];
  REF_INT local_a8 [2];
  int local_a0;
  int local_9c;
  
  pRVar5 = (REF_FACELIFT)malloc(0x38);
  *ref_facelift_ptr = pRVar5;
  if (pRVar5 == (REF_FACELIFT)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",0x79
           ,"ref_facelift_create","malloc *ref_facelift_ptr of REF_FACELIFT_STRUCT NULL");
    return 2;
  }
  pRVar5->grid = freeable_ref_grid;
  pRVar5->edg_cell = freeable_ref_grid->cell[0];
  pRVar5->tri_cell = freeable_ref_grid->cell[3];
  if (0 < freeable_ref_grid->cell[1]->n) {
    pRVar5->edg_cell = freeable_ref_grid->cell[1];
  }
  if (0 < freeable_ref_grid->cell[2]->n) {
    pRVar5->edg_cell = freeable_ref_grid->cell[2];
  }
  if (0 < freeable_ref_grid->cell[4]->n) {
    pRVar5->tri_cell = freeable_ref_grid->cell[4];
  }
  if (0 < freeable_ref_grid->cell[5]->n) {
    pRVar5->tri_cell = freeable_ref_grid->cell[5];
  }
  if (direct == 0) {
    iVar10 = freeable_ref_grid->geom->max;
    if ((long)iVar10 < 0) {
      bVar2 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x9a,"ref_facelift_create","malloc ref_facelift->displacement of REF_DBL negative");
      unaff_R12D = 1;
    }
    else {
      uVar3 = iVar10 * 3;
      __s = (REF_DBL *)malloc((ulong)uVar3 << 3);
      pRVar5->displacement = __s;
      if (__s == (REF_DBL *)0x0) {
        bVar2 = false;
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x9a,"ref_facelift_create","malloc ref_facelift->displacement of REF_DBL NULL");
        unaff_R12D = 2;
      }
      else {
        bVar2 = true;
        if (iVar10 != 0) {
          uVar9 = 1;
          if (1 < (int)uVar3) {
            uVar9 = (ulong)uVar3;
          }
          memset(__s,0,uVar9 << 3);
        }
      }
    }
    if (!bVar2) {
      return unaff_R12D;
    }
    if (iVar10 < 0) {
      bVar2 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x9b,"ref_facelift_create","malloc ref_facelift->strong_bc of REF_BOOL negative");
      unaff_R12D = 1;
    }
    else {
      __size = (long)iVar10 * 4;
      __s_00 = (REF_BOOL *)malloc(__size);
      pRVar5->strong_bc = __s_00;
      if (__s_00 == (REF_BOOL *)0x0) {
        bVar2 = false;
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x9b,"ref_facelift_create","malloc ref_facelift->strong_bc of REF_BOOL NULL");
        unaff_R12D = 2;
      }
      else {
        bVar2 = true;
        if (iVar10 != 0) {
          memset(__s_00,0,__size);
        }
      }
    }
    if (!bVar2) {
      return unaff_R12D;
    }
  }
  else {
    pRVar5->displacement = (REF_DBL *)0x0;
    pRVar5->strong_bc = (REF_BOOL *)0x0;
  }
  ref_geom = pRVar5->grid->geom;
  pRVar5->edge_search = (REF_SEARCH *)0x0;
  uVar3 = ref_geom->nedge;
  uVar9 = (ulong)(int)uVar3;
  if (0 < (long)uVar9) {
    pRVar1 = pRVar5->edg_cell;
    ppRVar6 = (REF_SEARCH *)malloc(uVar9 * 8);
    pRVar5->edge_search = ppRVar6;
    if (ppRVar6 == (REF_SEARCH *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x40,"ref_facelift_cache_search","malloc ref_facelift->edge_search of REF_SEARCH NULL")
      ;
    }
    else {
      uVar7 = 0;
      do {
        pRVar5->edge_search[uVar7] = (REF_SEARCH)0x0;
        uVar7 = uVar7 + 1;
      } while (uVar9 != uVar7);
    }
    if (ppRVar6 == (REF_SEARCH *)0x0) {
      uVar9 = 2;
      goto LAB_001504fb;
    }
    uVar7 = 1;
    if (1 < (int)uVar3) {
      uVar7 = (ulong)uVar3;
    }
    uVar9 = 2;
    lVar11 = 0;
    do {
      uVar3 = ref_search_create((REF_SEARCH *)((long)pRVar5->edge_search + lVar11),pRVar1->n);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x44,"ref_facelift_cache_search",(ulong)uVar3,"create edge search");
        uVar9 = (ulong)uVar3;
        goto LAB_001504fb;
      }
      lVar11 = lVar11 + 8;
    } while (uVar7 * 8 != lVar11);
    if (0 < pRVar1->max) {
      iVar10 = 0;
      do {
        RVar4 = ref_cell_nodes(pRVar1,iVar10,local_a8);
        if (RVar4 == 0) {
          local_a0 = local_a8[pRVar1->node_per];
          uVar3 = ref_geom_edg_t_bounding_sphere2(ref_geom,local_a8,local_c8,&local_d0);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                   ,0x4b,"ref_facelift_cache_search",(ulong)uVar3,"bound with circle");
            uVar9 = (ulong)uVar3;
            goto LAB_001504fb;
          }
          local_c8[1] = 0.0;
          local_c8[2] = 0.0;
          uVar3 = ref_search_insert(pRVar5->edge_search[(long)local_a0 + -1],iVar10,local_c8,
                                    local_d0 + local_d0);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                   ,0x51,"ref_facelift_cache_search",(ulong)uVar3,"ins");
            uVar9 = (ulong)uVar3;
            goto LAB_001504fb;
          }
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 < pRVar1->max);
    }
  }
  pRVar5->face_search = (REF_SEARCH *)0x0;
  uVar3 = ref_geom->nface;
  lVar11 = (long)(int)uVar3;
  if (0 < lVar11) {
    pRVar1 = pRVar5->tri_cell;
    ppRVar6 = (REF_SEARCH *)malloc(lVar11 * 8);
    pRVar5->face_search = ppRVar6;
    if (ppRVar6 == (REF_SEARCH *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x5c,"ref_facelift_cache_search","malloc ref_facelift->face_search of REF_SEARCH NULL")
      ;
      uVar9 = 2;
    }
    else {
      lVar8 = 0;
      do {
        pRVar5->face_search[lVar8] = (REF_SEARCH)0x0;
        lVar8 = lVar8 + 1;
      } while (lVar11 != lVar8);
    }
    if (ppRVar6 == (REF_SEARCH *)0x0) goto LAB_001504fb;
    uVar9 = 1;
    if (1 < (int)uVar3) {
      uVar9 = (ulong)uVar3;
    }
    lVar11 = 0;
    do {
      uVar3 = ref_search_create((REF_SEARCH *)((long)pRVar5->face_search + lVar11),pRVar1->n);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
               0x60,"ref_facelift_cache_search",(ulong)uVar3,"create face search");
        uVar9 = (ulong)uVar3;
        goto LAB_001504fb;
      }
      lVar11 = lVar11 + 8;
    } while (uVar9 * 8 != lVar11);
    if (0 < pRVar1->max) {
      iVar10 = 0;
      do {
        RVar4 = ref_cell_nodes(pRVar1,iVar10,local_a8);
        if (RVar4 == 0) {
          local_9c = local_a8[pRVar1->node_per];
          uVar3 = ref_geom_tri_uv_bounding_sphere3(ref_geom,local_a8,local_c8,&local_d0);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                   ,0x67,"ref_facelift_cache_search",(ulong)uVar3,"bound with circle");
            uVar9 = (ulong)uVar3;
            goto LAB_001504fb;
          }
          local_c8[2] = 0.0;
          uVar3 = ref_search_insert(pRVar5->face_search[(long)local_9c + -1],iVar10,local_c8,
                                    local_d0 + local_d0);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                   ,0x6c,"ref_facelift_cache_search",(ulong)uVar3,"ins");
            uVar9 = (ulong)uVar3;
            goto LAB_001504fb;
          }
        }
        iVar10 = iVar10 + 1;
      } while (iVar10 < pRVar1->max);
    }
  }
  uVar9 = 0;
LAB_001504fb:
  RVar4 = (REF_STATUS)uVar9;
  if (RVar4 == 0) {
    RVar4 = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",0x9e
           ,"ref_facelift_create",uVar9 & 0xffffffff,"cache tri uv");
  }
  return RVar4;
}

Assistant:

REF_FCN REF_STATUS ref_facelift_create(REF_FACELIFT *ref_facelift_ptr,
                                       REF_GRID freeable_ref_grid,
                                       REF_BOOL direct) {
  REF_FACELIFT ref_facelift;
  REF_INT n;

  ref_malloc(*ref_facelift_ptr, 1, REF_FACELIFT_STRUCT);

  ref_facelift = *ref_facelift_ptr;

  ref_facelift_grid(ref_facelift) = freeable_ref_grid;

  ref_facelift_edg(ref_facelift) =
      ref_grid_edg(ref_facelift_grid(ref_facelift));
  ref_facelift_tri(ref_facelift) =
      ref_grid_tri(ref_facelift_grid(ref_facelift));

  if (ref_cell_n(ref_grid_ed2(ref_facelift_grid(ref_facelift))) > 0) {
    ref_facelift_edg(ref_facelift) =
        ref_grid_ed2(ref_facelift_grid(ref_facelift));
  }
  if (ref_cell_n(ref_grid_ed3(ref_facelift_grid(ref_facelift))) > 0) {
    ref_facelift_edg(ref_facelift) =
        ref_grid_ed3(ref_facelift_grid(ref_facelift));
  }
  if (ref_cell_n(ref_grid_tr2(ref_facelift_grid(ref_facelift))) > 0) {
    ref_facelift_tri(ref_facelift) =
        ref_grid_tr2(ref_facelift_grid(ref_facelift));
  }
  if (ref_cell_n(ref_grid_tr3(ref_facelift_grid(ref_facelift))) > 0) {
    ref_facelift_tri(ref_facelift) =
        ref_grid_tr3(ref_facelift_grid(ref_facelift));
  }

  if (direct) {
    ref_facelift->displacement = NULL;
    ref_facelift->strong_bc = NULL;
  } else {
    n = ref_geom_max(ref_facelift_geom(ref_facelift));
    ref_malloc_init(ref_facelift->displacement, 3 * n, REF_DBL, 0.0);
    ref_malloc_init(ref_facelift->strong_bc, n, REF_BOOL, REF_FALSE);
  }

  RSS(ref_facelift_cache_search(ref_facelift), "cache tri uv");

  return REF_SUCCESS;
}